

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O3

void __thiscall Activation::Set(Activation *this,size_t up_index,size_t right_index,Sexp *value)

{
  pointer *pppSVar1;
  iterator __position;
  pointer ppSVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  size_t diff;
  Sexp *local_50;
  size_t local_48;
  Sexp *local_40;
  ContractFrameProtector local_38;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_38,"Set");
  ContractFrame::AddContract(local_38.protected_frame,NoGc);
  if (value->kind == ACTIVATION) {
    __assert_fail("!value->IsActivation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                  ,0x42,"void Activation::Set(size_t, size_t, Sexp *)");
  }
  if (up_index != 0) {
    do {
      if (this == (Activation *)0x0) {
        __assert_fail("cursor != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x46,"void Activation::Set(size_t, size_t, Sexp *)");
      }
      if (this->parent->kind != ACTIVATION) {
        __assert_fail("cursor->parent->IsActivation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x47,"void Activation::Set(size_t, size_t, Sexp *)");
      }
      this = (this->parent->field_1).activation;
      up_index = up_index - 1;
    } while (up_index != 0);
    if (this == (Activation *)0x0) {
      __assert_fail("cursor != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                    ,0x4b,"void Activation::Set(size_t, size_t, Sexp *)");
    }
  }
  ppSVar2 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = (long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3;
  local_48 = right_index;
  if (uVar3 <= right_index) {
    uVar4 = 0;
    local_40 = value;
    do {
      local_50 = (Sexp *)0x0;
      __position._M_current =
           (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Sexp*,std::allocator<Sexp*>>::_M_realloc_insert<Sexp*>
                  ((vector<Sexp*,std::allocator<Sexp*>> *)&this->slots,__position,&local_50);
      }
      else {
        *__position._M_current = (Sexp *)0x0;
        pppSVar1 = &(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= right_index - uVar3);
    ppSVar2 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar3 = (long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3;
    value = local_40;
  }
  if (local_48 < uVar3) {
    ppSVar2[local_48] = value;
    ContractFrameProtector::~ContractFrameProtector(&local_38);
    return;
  }
  __assert_fail("right_index < cursor->slots.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                ,0x55,"void Activation::Set(size_t, size_t, Sexp *)");
}

Assistant:

void Activation::Set(size_t up_index, size_t right_index, Sexp *value) {
  CONTRACT { FORBID_GC; }